

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
kratos::EnableStmtVisitor::get_ssa_en_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,EnableStmtVisitor *this,Attribute *attr)

{
  int iVar1;
  size_type sVar2;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> v;
  size_type pos;
  allocator<char> local_49;
  string local_48 [32];
  char *local_28;
  char *en_str;
  string *value_str;
  Attribute *attr_local;
  
  en_str = (char *)&(this->super_IRVisitor).visited_._M_h._M_element_count;
  local_28 = "ssa-en=";
  value_str = (string *)this;
  attr_local = (Attribute *)__return_storage_ptr__;
  if (get_ssa_en[abi:cxx11](kratos::Attribute_const*)::start_pos == '\0') {
    iVar1 = __cxa_guard_acquire(&get_ssa_en[abi:cxx11](kratos::Attribute_const*)::start_pos);
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_48,"ssa-en=",&local_49);
      sVar2 = std::__cxx11::string::size();
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator(&local_49);
      get_ssa_en::start_pos = sVar2;
      __cxa_guard_release(&get_ssa_en[abi:cxx11](kratos::Attribute_const*)::start_pos);
    }
  }
  v.field_2._8_8_ = std::__cxx11::string::rfind(en_str,0x43923e);
  if (v.field_2._8_8_ == 0) {
    std::__cxx11::string::substr((ulong)local_88,(ulong)en_str);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::optional<std::string> get_ssa_en(const Attribute* attr) {
        auto const& value_str = attr->value_str;
        constexpr auto en_str = "ssa-en=";
        auto static const start_pos = std::string(en_str).size();
        auto pos = value_str.rfind(en_str);
        if (pos == 0) {
            auto v = value_str.substr(start_pos);
            return v;
        } else {
            return std::nullopt;
        }
    }